

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int sprint_dns_header(char *dest,char *src)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  size_t sVar14;
  char *pcVar15;
  ushort uVar16;
  char *pcVar17;
  ushort uVar18;
  char *pcVar19;
  uint uVar20;
  uint uVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  short local_98;
  short local_60;
  short local_58;
  
  uVar1 = *(ushort *)(src + 4);
  uVar16 = *(ushort *)src << 8 | *(ushort *)src >> 8;
  uVar2 = *(ushort *)(src + 2);
  uVar3 = *(ushort *)(src + 6);
  uVar4 = *(ushort *)(src + 8);
  uVar5 = *(ushort *)(src + 10);
  uVar7 = uVar2 << 8 | uVar2 >> 8;
  uVar20 = uVar2 >> 3 & 0xf;
  bit_to_str_b[0] = 0;
  uVar18 = uVar2 >> 3 & 0xf;
  if ((char)uVar2 < '\0') {
    uVar9 = 8;
    do {
      sVar14 = strlen(bit_to_str_b);
      *(ushort *)(bit_to_str_b + sVar14) = ((uVar9 & ~uVar20) == 0) + 0x30;
      bVar6 = 1 < uVar9;
      uVar9 = uVar9 >> 1;
    } while (bVar6);
    uVar9 = uVar2 >> 2 & 1;
    uVar10 = uVar2 >> 1 & 1;
    uVar11 = uVar2 >> 0xd & 1;
    uVar12 = uVar2 >> 0xc & 1;
    uVar21 = uVar2 >> 8 & 0xf;
    bit_to_str_b[0] = 0;
    uVar20 = 8;
    do {
      sVar14 = strlen(bit_to_str_b);
      *(ushort *)(bit_to_str_b + sVar14) = ((uVar20 & ~uVar21) == 0) + 0x30;
      bVar6 = 1 < uVar20;
      uVar20 = uVar20 >> 1;
    } while (bVar6);
    pcVar17 = "Unknow";
    if (uVar18 == 1) {
      pcVar17 = "Reverse query (1)";
    }
    pcVar15 = "Standard query (0)";
    if (uVar18 != 0) {
      pcVar15 = pcVar17;
    }
    local_98 = (short)uVar9;
    pcVar17 = "Server is an authority for domain";
    if (local_98 == 0) {
      pcVar17 = "Server is not an authority for domain";
    }
    local_58 = (short)uVar10;
    pcVar25 = "Message is truncated";
    if (local_58 == 0) {
      pcVar25 = "Message is not truncated";
    }
    local_60 = (short)(uVar2 & 1);
    pcVar23 = "Do query recursively";
    pcVar24 = "Do query recursively";
    if (local_60 == 0) {
      pcVar24 = "Can\'t do recursively";
    }
    if (-1 < (short)uVar2) {
      pcVar23 = "Can\'t do recursively";
    }
    pcVar26 = "Answer/authority portion was authenticated by the server";
    if ((short)uVar11 == 0) {
      pcVar26 = "Answer/authority portion was not authenticated by the server";
    }
    pcVar19 = "Authenticated data";
    if ((short)uVar12 == 0) {
      pcVar19 = "Non-authenticated data";
    }
    if ((ushort)uVar21 < 6) {
      pcVar22 = &DAT_00103218 + *(int *)(&DAT_00103218 + (ulong)uVar21 * 4);
    }
    else {
      pcVar22 = "Unknow Eansweror";
    }
    iVar8 = sprintf(dest,
                    "------------------------------------\nTransaction ID: 0x%2x\nFLAG: 0x%04x\n%d... .... .... .... = Response:%s\n.%s... .... .... = Opcode: %s\n.... .%d.. .... .... = Authoritative: %s\n.... ..%d. .... .... = Truncated: %s\n.... ...%d .... .... = Recursion desired: %s\n.... .... %d... .... = Recursion available: %s\n.... .... .%d.. .... = Z: reserved (0)\n.... .... ..%d. .... = Answer authenticated: %s\n.... .... ..%d .... = %s\n.... .... .... %s = Reply code: %s\n"
                    ,(ulong)uVar16,uVar7,1,"Message is a response",bit_to_str_b,pcVar15,(ulong)uVar9
                    ,pcVar17,(ulong)uVar10,pcVar25,(ulong)(uVar2 & 1),pcVar24,(ulong)(uVar2 >> 0xf),
                    pcVar23,(ulong)(uVar2 >> 0xe) & 1,(ulong)uVar11,pcVar26,(ulong)uVar12,pcVar19,
                    bit_to_str_b,pcVar22);
  }
  else {
    uVar9 = 8;
    do {
      sVar14 = strlen(bit_to_str_b);
      *(ushort *)(bit_to_str_b + sVar14) = ((uVar9 & ~uVar20) == 0) + 0x30;
      bVar6 = 1 < uVar9;
      uVar9 = uVar9 >> 1;
    } while (bVar6);
    pcVar17 = "Unknow";
    if (uVar18 == 1) {
      pcVar17 = "Reverse query (1)";
    }
    pcVar15 = "Standard query (0)";
    if (uVar18 != 0) {
      pcVar15 = pcVar17;
    }
    pcVar17 = "Message is truncated";
    if ((uVar2 >> 1 & 1) == 0) {
      pcVar17 = "Message is not truncated";
    }
    pcVar25 = "Do query recursively";
    if ((uVar2 & 1) == 0) {
      pcVar25 = "Can\'t do recursively";
    }
    pcVar23 = "Authenticated data";
    if ((uVar2 >> 0xc & 1) == 0) {
      pcVar23 = "Non-authenticated data";
    }
    iVar8 = sprintf(dest,
                    "------------------------------------\nTransaction ID: 0x%2x\nFLAG: 0x%04x\n%d... .... .... .... = Response:%s\n.%s... .... ....  = Opcode: %s\n.... ..%d. .... .... = Truncated: %s\n.... ...%d .... .... = Recursion desired: %s\n.... .... .%d.. .... = Z: reserved (0)\n.... .... ...%d .... = %s\n"
                    ,uVar16,uVar7,0,"Message is a query",bit_to_str_b,pcVar15,
                    (ulong)(uVar2 >> 1 & 1),pcVar17,(ulong)(uVar2 & 1),pcVar25,
                    (ulong)(uVar2 >> 0xe & 1),(ulong)(uVar2 >> 0xc & 1),pcVar23);
  }
  iVar13 = sprintf(dest + iVar8,
                   "Questions: %d\nAnswer answers: %d \nAuthority answers: %d\nAdditional answers: %d\n"
                   ,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8),
                   (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8),(ulong)(ushort)(uVar4 << 8 | uVar4 >> 8)
                   ,(ulong)(ushort)(uVar5 << 8 | uVar5 >> 8));
  return iVar13 + iVar8;
}

Assistant:

int sprint_dns_header(char *dest, char *src) {
  struct dns_header header;
  read_dns_header(&header, src);
  int size = 0;
  if (!header.qr) {
    //询问
    size += sprintf(dest, "------------------------------------\n\
Transaction ID: 0x%2x\n\
FLAG: 0x%04x\n\\
%d... .... .... .... = Response:%s\n\
.%s... .... ....  = Opcode: %s\n\
.... ..%d. .... .... = Truncated: %s\n\
.... ...%d .... .... = Recursion desired: %s\n\
.... .... .%d.. .... = Z: reserved (0)\n\
.... .... ...%d .... = %s\n",
                    header.id,
                    ntohs(header.flags), //为了打印需要
                    0, debugstr(DEBUG_PRINT_TYPE_qr, header.qr),
                    bit_to_str(header.opcode, 4),
                    debugstr(DEBUG_PRINT_TYPE_opcode, header.opcode), header.tc,
                    debugstr(DEBUG_PRINT_TYPE_tc, header.tc), header.rd,
                    debugstr(DEBUG_PRINT_TYPE_rd, header.rd), header.z,
                    header.cd, debugstr(DEBUG_PRINT_TYPE_cd, header.cd));
  } else {
    //回答
    size += sprintf(
        dest, "------------------------------------\n\
Transaction ID: 0x%2x\n\
FLAG: 0x%04x\n\
%d... .... .... .... = Response:%s\n\
.%s... .... .... = Opcode: %s\n\
.... .%d.. .... .... = Authoritative: %s\n\
.... ..%d. .... .... = Truncated: %s\n\
.... ...%d .... .... = Recursion desired: %s\n\
.... .... %d... .... = Recursion available: %s\n\
.... .... .%d.. .... = Z: reserved (0)\n\
.... .... ..%d. .... = Answer authenticated: %s\n\
.... .... ..%d .... = %s\n\
.... .... .... %s = Reply code: %s\n",
        header.id,
        ntohs(header.flags), ////为了打印需要
        1, debugstr(DEBUG_PRINT_TYPE_qr, 1), bit_to_str(header.opcode, 4),
        debugstr(DEBUG_PRINT_TYPE_opcode, header.opcode), header.aa,
        debugstr(DEBUG_PRINT_TYPE_aa, header.aa), header.tc,
        debugstr(DEBUG_PRINT_TYPE_tc, header.tc), header.rd,
        debugstr(DEBUG_PRINT_TYPE_rd, header.rd), header.ra,
        debugstr(DEBUG_PRINT_TYPE_ra, header.ra), header.z, header.ad,
        debugstr(DEBUG_PRINT_TYPE_ad, header.ad), header.cd,
        debugstr(DEBUG_PRINT_TYPE_cd, header.cd), bit_to_str(header.rcode, 4),
        debugstr(DEBUG_PRINT_TYPE_rcode, header.rcode));
  }
  dest += size;
  size +=
      sprintf(dest, "Questions: %d\n\
Answer answers: %d \n\
Authority answers: %d\n\
Additional answers: %d\n",
              header.qdcount, header.ancount, header.nscount, header.adcount);
  return size;
}